

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D.c
# Opt level: O0

void envy_bios_parse_D_unk2(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_D_unk2 *peVar4;
  envy_bios_D_unk2_entry *peVar5;
  envy_bios_D_unk2_entry *e;
  int i;
  int err;
  envy_bios_D_unk2 *unk2;
  envy_bios *bios_local;
  
  peVar4 = &(bios->D).unk2;
  if (peVar4->offset != 0) {
    bios_u8(bios,(uint)peVar4->offset,&(bios->D).unk2.version);
    if ((bios->D).unk2.version == ' ') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->D).unk2.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->D).unk2.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->D).unk2.entriesnum);
      (bios->D).unk2.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_D_unk2_entry *)malloc((ulong)(bios->D).unk2.entriesnum << 1);
      (bios->D).unk2.entries = peVar5;
      for (e._0_4_ = 0; (int)e < (int)(uint)(bios->D).unk2.entriesnum; e._0_4_ = (int)e + 1) {
        (bios->D).unk2.entries[(int)e].offset =
             peVar4->offset + (ushort)(bios->D).unk2.hlen +
             (short)(int)e * (ushort)(bios->D).unk2.rlen;
      }
    }
    else {
      fprintf(_stderr,"Unknown UNK2 table version 0x%x\n",(ulong)(bios->D).unk2.version);
    }
  }
  return;
}

Assistant:

static void
envy_bios_parse_D_unk2(struct envy_bios *bios)
{
	struct envy_bios_D_unk2 *unk2 = &bios->D.unk2;
	int err = 0, i;

	if (!unk2->offset)
		return;

	bios_u8(bios, unk2->offset, &unk2->version);
	switch (unk2->version) {
	case 0x20:
		err |= bios_u8(bios, unk2->offset + 0x1, &unk2->hlen);
		err |= bios_u8(bios, unk2->offset + 0x2, &unk2->rlen);
		err |= bios_u8(bios, unk2->offset + 0x3, &unk2->entriesnum);
		unk2->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown UNK2 table version 0x%x\n", unk2->version);
		return;
	}

	unk2->entries = malloc(unk2->entriesnum * sizeof(struct envy_bios_D_unk2_entry));
	for (i = 0; i < unk2->entriesnum; ++i) {
		struct envy_bios_D_unk2_entry *e = &unk2->entries[i];
		e->offset = unk2->offset + unk2->hlen + i * unk2->rlen;
	}
}